

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::basisu_transcoder_init(void)

{
  ushort uVar1;
  uint32_t i;
  int iVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined1 *puVar5;
  char cVar6;
  byte bVar7;
  uint32_t base_color;
  int iVar8;
  long lVar9;
  int i_3;
  uint32_t range_index;
  long lVar10;
  uint *puVar11;
  uint32_t k_inv;
  int iVar12;
  uint32_t bit;
  ulong uVar13;
  int *piVar14;
  int lo_1;
  uint uVar15;
  ulong uVar16;
  uint32_t l;
  int iVar17;
  long lVar18;
  uint32_t inten_table;
  int iVar19;
  long lVar20;
  int best_l;
  int iVar21;
  ulong uVar22;
  uint32_t h;
  int iVar23;
  long lVar24;
  uint32_t mapping_index;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  uint32_t i_5;
  uint uVar28;
  uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1_inv [4];
  uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1 [4];
  uint8_t bc1_expand5 [32];
  uint8_t bc1_expand6 [64];
  
  if (g_transcoder_initialized == '\0') {
    uastc_init();
    lVar3 = 0x1ce8d2;
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
      lVar18 = lVar3;
      for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 1) {
        lVar24 = lVar18;
        for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
          uVar13 = 0;
          uVar15 = 0xffffffff;
          for (uVar27 = 0; uVar27 != 10; uVar27 = uVar27 + 1) {
            uVar1 = *(ushort *)(lVar24 + uVar27 * 4);
            uVar25 = uVar15;
            if (uVar1 <= uVar15) {
              uVar25 = (uint)uVar1;
            }
            uVar13 = uVar13 & 0xff;
            if (uVar1 < uVar15) {
              uVar13 = uVar27 & 0xffffffff;
            }
            uVar15 = uVar25;
          }
          (&g_etc1_to_astc_best_grayscale_mapping)[lVar10 + lVar20 * 6 + lVar9 * 0x30] =
               (char)uVar13;
          lVar24 = lVar24 + 0x28;
        }
        lVar18 = lVar18 + 0x1e00;
      }
      lVar3 = lVar3 + 0xf0;
    }
    lVar3 = 0x1dd8d2;
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
      lVar18 = lVar3;
      for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 1) {
        lVar24 = lVar18;
        for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
          uVar13 = 0;
          uVar15 = 0xffffffff;
          for (uVar27 = 0; uVar27 != 10; uVar27 = uVar27 + 1) {
            uVar1 = *(ushort *)(lVar24 + uVar27 * 4);
            uVar25 = uVar15;
            if (uVar1 <= uVar15) {
              uVar25 = (uint)uVar1;
            }
            uVar13 = uVar13 & 0xff;
            if (uVar1 < uVar15) {
              uVar13 = uVar27 & 0xffffffff;
            }
            uVar15 = uVar25;
          }
          (&g_etc1_to_astc_best_grayscale_mapping_0_255)[lVar10 + lVar20 * 6 + lVar9 * 0x30] =
               (char)uVar13;
          lVar24 = lVar24 + 0x28;
        }
        lVar18 = lVar18 + 0x1e00;
      }
      lVar3 = lVar3 + 0xf0;
    }
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      *(int *)(g_etc1_to_astc_selector_range_index +
              (ulong)(uint)(&DAT_001ec8d4)[lVar3 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar3 * 2] * 0x10) = (int)lVar3;
    }
    puVar4 = &g_ise_to_unquant;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      for (uVar13 = 0; uVar13 != 0x10; uVar13 = uVar13 + 1) {
        uVar15 = -((uint)uVar13 & 1);
        puVar4[uVar13] =
             (((uint)(uVar13 >> 1) & 0x7fffffff) * 0x41 + (int)lVar3 * 0x16 ^ uVar15 & 0x1fc) >> 2 |
             uVar15 & 0x80;
      }
      puVar4 = puVar4 + 0x10;
    }
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      iVar8 = 0x7fffffff;
      for (lVar9 = 0; lVar9 != 0x30; lVar9 = lVar9 + 1) {
        uVar15 = (&g_ise_to_unquant)[lVar9];
        puVar11 = &g_ise_to_unquant;
        for (lVar18 = 0; lVar18 != 0x30; lVar18 = lVar18 + 1) {
          iVar2 = ((int)((*puVar11 << 8 | *puVar11) * 0x15 + (uVar15 << 8 | uVar15) * 0x2b + 0x20) /
                   0x40 >> 8) - (int)lVar3;
          iVar21 = -iVar2;
          if (0 < iVar2) {
            iVar21 = iVar2;
          }
          if (iVar21 < iVar8) {
            (&DAT_0028a6f1)[lVar3 * 2] = (char)lVar18;
            (&g_astc_single_color_encoding_1)[lVar3 * 2] = (char)lVar9;
            iVar8 = iVar21;
          }
          puVar11 = puVar11 + 1;
        }
      }
    }
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      iVar8 = 0x7fffffff;
      piVar14 = &g_ise_to_unquant;
      for (lVar9 = 0; lVar9 != 0x30; lVar9 = lVar9 + 1) {
        iVar2 = *piVar14 - (int)lVar3;
        iVar21 = -iVar2;
        if (0 < iVar2) {
          iVar21 = iVar2;
        }
        if (iVar21 < iVar8) {
          (&g_astc_single_color_encoding_0)[lVar3] = (char)lVar9;
          iVar8 = iVar21;
        }
        piVar14 = piVar14 + 1;
      }
    }
    uVar15 = 0;
    cVar6 = '\0';
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      bc1_expand5[lVar3] = (char)(uVar15 >> 2) + cVar6;
      cVar6 = cVar6 + '\b';
      uVar15 = uVar15 + 1;
    }
    prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match5_equals_1,bc1_expand5,0x20,0x20,1)
    ;
    uVar15 = 0;
    prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match5_equals_0,bc1_expand5,1,0x20,0);
    cVar6 = '\0';
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      bc1_expand6[lVar3] = (char)(uVar15 >> 4) + cVar6;
      cVar6 = cVar6 + '\x04';
      uVar15 = uVar15 + 1;
    }
    prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match6_equals_1,bc1_expand6,0x40,0x40,1)
    ;
    prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match6_equals_0,bc1_expand6,1,0x40,0);
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      *(int *)(g_etc1_to_dxt1_selector_range_index +
              (ulong)(uint)(&DAT_001ec8d4)[lVar3 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar3 * 2] * 0x10) = (int)lVar3;
    }
    puVar5 = &g_etc1s_to_atc_selector_mappings;
    for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        bVar7 = ""[(byte)puVar5[lVar9]];
        etc1_to_dxt1_selector_mappings_raw_dxt1[lVar9] = bVar7;
        etc1_to_dxt1_selector_mappings_raw_dxt1_inv[lVar9] = "\x01"[bVar7];
      }
      for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
        uVar25 = 0;
        uVar15 = 0;
        for (iVar8 = 0; iVar8 != 8; iVar8 = iVar8 + 2) {
          bVar7 = (byte)iVar8;
          uVar28 = (uint)lVar9 >> (bVar7 & 0x1f) & 3;
          uVar25 = uVar25 | (uint)etc1_to_dxt1_selector_mappings_raw_dxt1[uVar28] << (bVar7 & 0x1f);
          uVar15 = uVar15 | (uint)etc1_to_dxt1_selector_mappings_raw_dxt1_inv[uVar28] <<
                            (bVar7 & 0x1f);
        }
        (&g_etc1_to_dxt1_selector_mappings_raw_dxt1_256)[lVar9 + lVar3 * 0x100] = (char)uVar25;
        (&g_etc1_to_dxt1_selector_mappings_raw_dxt1_inv_256)[lVar9 + lVar3 * 0x100] = (char)uVar15;
      }
      puVar5 = puVar5 + 4;
    }
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      *(int *)(g_etc1_to_bc7_m5_selector_range_index +
              (ulong)(uint)(&DAT_001ec8d4)[lVar3 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar3 * 2] * 0x10) = (int)lVar3;
    }
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      *(int *)(g_etc1_to_bc7_m5a_selector_range_index +
              (ulong)(uint)(&DAT_001ec8d4)[lVar3 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar3 * 2] * 0x10) = (int)lVar3;
    }
    prepare_atc_single_color_table((atc_match_entry *)g_pvrtc2_match45_equals_1,0x10,0x20,1);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match55_equals_1,0x20,0x20,1);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match56_equals_1,0x20,0x40,1);
    prepare_atc_single_color_table((atc_match_entry *)g_pvrtc2_match4,1,0x10,3);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match5,1,0x20,3);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match6,1,0x40,3);
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      *(int *)(g_etc1s_to_atc_selector_range_index +
              (ulong)(uint)(&DAT_001ec8d4)[lVar3 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar3 * 2] * 0x10) = (int)lVar3;
    }
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      iVar8 = 0x7fffffff;
      uVar13 = 0x33;
      iVar21 = 0;
      iVar2 = 0;
      for (iVar17 = 0; iVar17 != 8; iVar17 = iVar17 + 1) {
        iVar19 = (int)uVar13;
        for (iVar23 = 0; iVar23 != 8; iVar23 = iVar23 + 1) {
          iVar26 = (int)lVar3 - (int)(uVar13 >> 3);
          iVar12 = -iVar26;
          if (0 < iVar26) {
            iVar12 = iVar26;
          }
          if (iVar12 < iVar8) {
            iVar2 = iVar17;
            iVar21 = iVar23;
            iVar8 = iVar12;
          }
          uVar13 = (ulong)((int)uVar13 + 0x66);
        }
        uVar13 = (ulong)(iVar19 + 0xaa);
      }
      (&g_pvrtc2_alpha_match33)[lVar3 * 2] = (char)iVar2;
      (&DAT_0028b631)[lVar3 * 2] = (char)iVar21;
    }
    for (uVar13 = 0; uVar13 != 0x100; uVar13 = uVar13 + 1) {
      uVar27 = 0x7fffffff;
      iVar8 = 0;
      uVar16 = uVar13 & 0xffffffff;
      iVar21 = 0;
      for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
        iVar17 = (int)uVar16;
        uVar22 = (ulong)(uint)-iVar17;
        if (0 < iVar17) {
          uVar22 = uVar16;
        }
        if ((int)uVar22 < (int)uVar27) {
          iVar21 = iVar2;
          iVar8 = iVar2;
          uVar27 = uVar22;
        }
        uVar16 = (ulong)(iVar17 - 0x22);
      }
      (&g_pvrtc2_alpha_match33_0)[uVar13 * 2] = (char)iVar21;
      (&DAT_0028b831)[uVar13 * 2] = (char)iVar8;
    }
    iVar8 = -0x11;
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      iVar19 = 0x7fffffff;
      iVar21 = 0;
      iVar2 = 0;
      iVar17 = iVar8;
      for (iVar23 = 0; iVar23 != 8; iVar23 = iVar23 + 1) {
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        if (iVar12 < iVar19) {
          iVar21 = iVar23;
          iVar2 = iVar23;
          iVar19 = iVar12;
        }
        iVar17 = iVar17 + -0x22;
      }
      (&g_pvrtc2_alpha_match33_3)[lVar3 * 2] = (char)iVar21;
      (&DAT_0028ba31)[lVar3 * 2] = (char)iVar2;
      iVar8 = iVar8 + 1;
    }
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      iVar8 = 0x7fffffff;
      uVar15 = 0;
      uVar13 = 0;
      for (uVar25 = 0; uVar25 != 8; uVar25 = uVar25 + 1) {
        iVar21 = 0;
        uVar27 = 0;
        while (uVar28 = (uint)uVar27, uVar28 != 0x10) {
          iVar17 = (int)lVar3 -
                   (((uVar28 & 8) + (int)(uVar27 >> 1) + iVar21) * 3 +
                    uVar25 * 0xa5 + (uVar25 & 6) * 0x14 >> 3);
          iVar2 = -iVar17;
          if (0 < iVar17) {
            iVar2 = iVar17;
          }
          if (iVar2 < iVar8) {
            iVar8 = iVar2;
            uVar15 = uVar25;
            uVar13 = uVar27;
          }
          iVar21 = iVar21 + 0x10;
          uVar27 = (ulong)(uVar28 + 1);
        }
      }
      (&g_pvrtc2_trans_match34)[lVar3 * 2] = (char)uVar15;
      (&DAT_0028bc31)[lVar3 * 2] = (char)uVar13;
    }
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      iVar8 = 0x7fffffff;
      uVar13 = 0;
      uVar27 = 0;
      uVar16 = 0;
      while (uVar15 = (uint)uVar16, uVar15 != 0x10) {
        iVar21 = 0;
        uVar22 = 0;
        while (uVar25 = (uint)uVar22, uVar25 != 0x10) {
          iVar17 = (int)lVar3 -
                   (((uVar25 & 8) + (int)(uVar22 >> 1) + iVar21) * 3 +
                    ((int)(uVar16 >> 1) + (uVar15 & 8 | uVar15 << 4)) * 5 >> 3);
          iVar2 = -iVar17;
          if (0 < iVar17) {
            iVar2 = iVar17;
          }
          if (iVar2 < iVar8) {
            iVar8 = iVar2;
            uVar13 = uVar16;
            uVar27 = uVar22;
          }
          iVar21 = iVar21 + 0x10;
          uVar22 = (ulong)(uVar25 + 1);
        }
        uVar16 = (ulong)(uVar15 + 1);
      }
      (&g_pvrtc2_trans_match44)[lVar3 * 2] = (char)uVar13;
      (&DAT_0028be31)[lVar3 * 2] = (char)uVar27;
    }
    g_transcoder_initialized = '\x01';
  }
  return;
}

Assistant:

void basisu_transcoder_init()
	{
		if (g_transcoder_initialized)
      {
         BASISU_DEVEL_ERROR("basisu_transcoder::basisu_transcoder_init: Called more than once\n");      
			return;
      }
         
     BASISU_DEVEL_ERROR("basisu_transcoder::basisu_transcoder_init: Initializing (this is not an error)\n");      

#if BASISD_SUPPORT_UASTC
		uastc_init();
#endif

#if BASISD_SUPPORT_ASTC
		transcoder_init_astc();
#endif
				
#if BASISD_WRITE_NEW_ASTC_TABLES
		create_etc1_to_astc_conversion_table_0_47();
		create_etc1_to_astc_conversion_table_0_255();
		exit(0);
#endif

#if BASISD_WRITE_NEW_BC7_MODE5_TABLES
		create_etc1_to_bc7_m5_color_conversion_table();
		create_etc1_to_bc7_m5_alpha_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_DXT1_TABLES
		create_etc1_to_dxt1_5_conversion_table();
		create_etc1_to_dxt1_6_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ETC2_EAC_A8_TABLES
		create_etc2_eac_a8_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ATC_TABLES
		create_etc1s_to_atc_conversion_tables();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ETC2_EAC_R11_TABLES
		create_etc2_eac_r11_conversion_table();
		exit(0);
#endif

#if BASISD_SUPPORT_DXT1 || BASISD_SUPPORT_UASTC
		uint8_t bc1_expand5[32];
		for (int i = 0; i < 32; i++)
			bc1_expand5[i] = static_cast<uint8_t>((i << 3) | (i >> 2));
		prepare_bc1_single_color_table(g_bc1_match5_equals_1, bc1_expand5, 32, 32, 1);
		prepare_bc1_single_color_table(g_bc1_match5_equals_0, bc1_expand5, 1, 32, 0);

		uint8_t bc1_expand6[64];
		for (int i = 0; i < 64; i++)
			bc1_expand6[i] = static_cast<uint8_t>((i << 2) | (i >> 4));
		prepare_bc1_single_color_table(g_bc1_match6_equals_1, bc1_expand6, 64, 64, 1);
		prepare_bc1_single_color_table(g_bc1_match6_equals_0, bc1_expand6, 1, 64, 0);

#if 0
		for (uint32_t i = 0; i < 256; i++)
		{
			printf("%u %u %u\n", i, (i * 63 + 127) / 255, g_bc1_match6_equals_0[i].m_hi);
		}
		exit(0);
#endif

#endif

#if BASISD_SUPPORT_DXT1
		for (uint32_t i = 0; i < NUM_ETC1_TO_DXT1_SELECTOR_RANGES; i++)
		{
			uint32_t l = g_etc1_to_dxt1_selector_ranges[i].m_low;
			uint32_t h = g_etc1_to_dxt1_selector_ranges[i].m_high;
			g_etc1_to_dxt1_selector_range_index[l][h] = i;
		}

		for (uint32_t sm = 0; sm < NUM_ETC1_TO_DXT1_SELECTOR_MAPPINGS; sm++)
		{
			uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1[4];
			uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1_inv[4];

			for (uint32_t j = 0; j < 4; j++)
			{
				static const uint8_t s_linear_dxt1_to_dxt1[4] = { 0, 2, 3, 1 };
				static const uint8_t s_dxt1_inverted_xlat[4] = { 1, 0, 3, 2 };

				etc1_to_dxt1_selector_mappings_raw_dxt1[j] = (uint8_t)s_linear_dxt1_to_dxt1[g_etc1_to_dxt1_selector_mappings[sm][j]];
				etc1_to_dxt1_selector_mappings_raw_dxt1_inv[j] = (uint8_t)s_dxt1_inverted_xlat[etc1_to_dxt1_selector_mappings_raw_dxt1[j]];
			}

			for (uint32_t i = 0; i < 256; i++)
			{
				uint32_t k = 0, k_inv = 0;
				for (uint32_t s = 0; s < 4; s++)
				{
					k |= (etc1_to_dxt1_selector_mappings_raw_dxt1[(i >> (s * 2)) & 3] << (s * 2));
					k_inv |= (etc1_to_dxt1_selector_mappings_raw_dxt1_inv[(i >> (s * 2)) & 3] << (s * 2));
				}
				g_etc1_to_dxt1_selector_mappings_raw_dxt1_256[sm][i] = (uint8_t)k;
				g_etc1_to_dxt1_selector_mappings_raw_dxt1_inv_256[sm][i] = (uint8_t)k_inv;
			}
		}
#endif

#if BASISD_SUPPORT_BC7_MODE5
		transcoder_init_bc7_mode5();
#endif

#if BASISD_SUPPORT_ATC
		transcoder_init_atc();
#endif

#if BASISD_SUPPORT_PVRTC2
		transcoder_init_pvrtc2();
#endif

		g_transcoder_initialized = true;
	}